

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_4,_4>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_4,_4>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *dst)

{
  pointer this_00;
  DefaultSampling<float> *pDVar1;
  size_type sVar2;
  reference src;
  Vector<float,_4> *pVVar3;
  float *pfVar4;
  int local_dc;
  float local_d8;
  int ndx;
  float x;
  Value mat;
  ulong local_50;
  size_t scalarNdx;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> scalars;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *dst_local;
  FloatFormat *fmt_local;
  DefaultSampling<tcu::Matrix<float,_4,_4>_> *this_local;
  
  scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)dst;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  pDVar1 = instance<vkt::shaderexecutor::DefaultSampling<float>>();
  (**(code **)*pDVar1)(pDVar1,fmt,(vector<float,_std::allocator<float>_> *)local_38);
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_38);
    this_00 = scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (sVar2 <= local_50) break;
    src = std::vector<float,_std::allocator<float>_>::operator[]
                    ((vector<float,_std::allocator<float>_> *)local_38,local_50);
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)(mat.m_data.m_data[3].m_data + 2),src);
    std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
              ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
               this_00,(value_type *)(mat.m_data.m_data[3].m_data + 2));
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(mat.m_data.m_data[3].m_data + 2));
    local_50 = local_50 + 1;
  }
  ndx = 0;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&x,(float *)&ndx);
  local_d8 = 1.0;
  pVVar3 = tcu::Matrix<float,_4,_4>::operator[]((Matrix<float,_4,_4> *)&x,0);
  pfVar4 = tcu::Vector<float,_4>::operator[](pVVar3,0);
  *pfVar4 = 1.0;
  for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
    pVVar3 = tcu::Matrix<float,_4,_4>::operator[]((Matrix<float,_4,_4> *)&x,3 - local_dc);
    pfVar4 = tcu::Vector<float,_4>::operator[](pVVar3,local_dc);
    *pfVar4 = local_d8;
    local_d8 = local_d8 * 2.0;
  }
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
            ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
             scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(value_type *)&x);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&x);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}